

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::applyMask(Image *this,Image *mask)

{
  byte *pbVar1;
  byte *pbVar2;
  uint8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint8 *puVar8;
  
  if (((this->width == mask->width) && (this->height == mask->height)) &&
     ((mask->depth | 8U) != 0x18)) {
    convertTo32(this);
    iVar6 = this->height;
    if (0 < iVar6) {
      pbVar2 = mask->pixels;
      puVar3 = this->pixels;
      iVar5 = this->width;
      iVar4 = 0;
      do {
        if (0 < iVar5) {
          iVar6 = 0;
          pbVar7 = pbVar2;
          puVar8 = puVar3;
          do {
            pbVar1 = pbVar7;
            if (mask->depth == 0x20) {
LAB_0010f0dc:
              puVar8[3] = pbVar1[3];
            }
            else if (mask->depth < 9) {
              pbVar1 = mask->palette + (ulong)*pbVar7 * 4;
              goto LAB_0010f0dc;
            }
            puVar8 = puVar8 + this->bpp;
            pbVar7 = pbVar7 + mask->bpp;
            iVar6 = iVar6 + 1;
            iVar5 = this->width;
          } while (iVar6 < iVar5);
          iVar6 = this->height;
        }
        puVar3 = puVar3 + this->stride;
        pbVar2 = pbVar2 + mask->stride;
        iVar4 = iVar4 + 1;
      } while (iVar4 < iVar6);
    }
  }
  return;
}

Assistant:

void
Image::applyMask(Image *mask)
{
	if(this->width != mask->width || this->height != mask->height)
		return;	// TODO: set an error
	// we could use alpha with 16 bits but what's the point?
	if(mask->depth == 16 || mask->depth == 24)
		return;

	this->convertTo32();
	assert(this->depth == 32);

	uint8 *line = this->pixels;
	uint8 *mline = mask->pixels;
	uint8 *p, *m;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		m = mline;
		for(int32 x = 0; x < this->width; x++){
			if(mask->depth == 32)
				p[3] = m[3];
			else if(mask->depth <= 8)
				p[3] = mask->palette[m[0]*4+3];
			p += this->bpp;
			m += mask->bpp;
		}
		line += this->stride;
		mline += mask->stride;
	}
}